

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O0

VkWriteDescriptorSetAccelerationStructureKHR * __thiscall
Diligent::ShaderResourceCacheVk::Resource::GetAccelerationStructureWriteInfo
          (VkWriteDescriptorSetAccelerationStructureKHR *__return_storage_ptr__,Resource *this)

{
  Char *pCVar1;
  IDeviceObject *pIVar2;
  TopLevelASVkImpl *this_00;
  VkAccelerationStructureKHR *ppVVar3;
  TopLevelASVkImpl *pTLASVk;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  Resource *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->Type != AccelerationStructure) {
    FormatString<char[44]>
              ((string *)local_30,(char (*) [44])"Acceleration structure resource is expected");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetAccelerationStructureWriteInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x35b);
    std::__cxx11::string::~string((string *)local_30);
  }
  pIVar2 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_((RefCntAutoPtr *)&this->pObject)
  ;
  if (pIVar2 == (IDeviceObject *)0x0) {
    FormatString<char[71]>
              ((string *)&pTLASVk,
               (char (*) [71])
               "Unable to get acceleration structure write info: cached object is null");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetAccelerationStructureWriteInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x35c);
    std::__cxx11::string::~string((string *)&pTLASVk);
  }
  this_00 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::TopLevelASVkImpl>
                      (&this->pObject);
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET_ACCELERATION_STRUCTURE_KHR;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->accelerationStructureCount = 1;
  ppVVar3 = TopLevelASVkImpl::GetVkTLASPtr(this_00);
  __return_storage_ptr__->pAccelerationStructures = ppVVar3;
  return __return_storage_ptr__;
}

Assistant:

VkWriteDescriptorSetAccelerationStructureKHR ShaderResourceCacheVk::Resource::GetAccelerationStructureWriteInfo() const
{
    VERIFY(Type == DescriptorType::AccelerationStructure, "Acceleration structure resource is expected");
    DEV_CHECK_ERR(pObject != nullptr, "Unable to get acceleration structure write info: cached object is null");

    const TopLevelASVkImpl* pTLASVk = pObject.ConstPtr<TopLevelASVkImpl>();

    VkWriteDescriptorSetAccelerationStructureKHR DescrAS;
    DescrAS.sType                      = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET_ACCELERATION_STRUCTURE_KHR;
    DescrAS.pNext                      = nullptr;
    DescrAS.accelerationStructureCount = 1;
    DescrAS.pAccelerationStructures    = pTLASVk->GetVkTLASPtr();

    return DescrAS;
}